

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixFileMgr.cpp
# Opt level: O2

XMLFilePos __thiscall
xercesc_4_0::PosixFileMgr::curPos(PosixFileMgr *this,FileHandle f,MemoryManager *manager)

{
  XMLFilePos XVar1;
  XMLPlatformUtilsException *this_00;
  
  if (f == (FileHandle)0x0) {
    this_00 = (XMLPlatformUtilsException *)__cxa_allocate_exception(0x30);
    XMLPlatformUtilsException::XMLPlatformUtilsException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/FileManagers/PosixFileMgr.cpp"
               ,0x6e,CPtr_PointerIsZero,manager);
  }
  else {
    XVar1 = ftell((FILE *)f);
    if (XVar1 != 0xffffffffffffffff) {
      return XVar1;
    }
    this_00 = (XMLPlatformUtilsException *)__cxa_allocate_exception(0x30);
    XMLPlatformUtilsException::XMLPlatformUtilsException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/FileManagers/PosixFileMgr.cpp"
               ,0x73,File_CouldNotGetSize,manager);
  }
  __cxa_throw(this_00,&XMLPlatformUtilsException::typeinfo,XMLException::~XMLException);
}

Assistant:

XMLFilePos
PosixFileMgr::curPos(FileHandle f, MemoryManager* const manager)
{
    if (!f)
        ThrowXMLwithMemMgr(XMLPlatformUtilsException, XMLExcepts::CPtr_PointerIsZero, manager);
		 
    long curPos = ftell((FILE*)f);
	
    if (curPos == -1)
        ThrowXMLwithMemMgr(XMLPlatformUtilsException, XMLExcepts::File_CouldNotGetSize, manager);

    return (XMLFilePos)curPos;
}